

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-io.h
# Opt level: O3

void __thiscall
mp::SolutionWriterImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::SolFileWriter>::
HandleSolution(SolutionWriterImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::SolFileWriter>
               *this,int status,CStringRef message,double *values,double *dual_values,double param_5
              )

{
  int iVar1;
  MultiObjTestSolver<2> *pMVar2;
  size_type sVar3;
  pointer pcVar4;
  char *pcVar5;
  Result RVar6;
  long lVar7;
  MockProblemBuilder *this_00;
  bool bVar8;
  Argument1 gmock_a1;
  Argument1 gmock_a1_00;
  Argument1 gmock_a1_01;
  Argument1 gmock_a1_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> dir;
  string solFilePath;
  SolutionAdapter<MultiObjMockProblemBuilder> sol;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  size_t local_118;
  long *local_110;
  CStringRef local_108;
  undefined8 local_100;
  char local_f8;
  undefined7 uStack_f7;
  SolutionAdapter<MultiObjMockProblemBuilder> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar8 = true;
  if ((this->solver_->super_SolverImpl<MultiObjMockProblemBuilder>).super_Solver.super_BasicSolver.
      count_solutions_ == false) {
    bVar8 = (this->solver_->super_SolverImpl<MultiObjMockProblemBuilder>).super_Solver.
            super_BasicSolver.solution_stub_._M_string_length != 0;
  }
  if ((values == (double *)0x0) || (!bVar8)) {
    this_00 = &this->builder_->super_MockProblemBuilder;
    local_110 = (this->options_).data_;
    local_118 = (this->options_).size_;
    if (values != (double *)0x0) goto LAB_001c3e87;
    local_e8.values_.size_ = 0;
  }
  else {
    gmock_a1.size_ = 4;
    gmock_a1.data_ = "nsol";
    MockProblemBuilder::AddIntSuffix(&this->builder_->super_MockProblemBuilder,gmock_a1,0x53,0);
    gmock_a1_00.size_ = 4;
    gmock_a1_00.data_ = "nsol";
    MockProblemBuilder::AddIntSuffix(&this->builder_->super_MockProblemBuilder,gmock_a1_00,0x52,0);
    gmock_a1_01.size_ = 5;
    gmock_a1_01.data_ = "npool";
    MockProblemBuilder::AddIntSuffix(&this->builder_->super_MockProblemBuilder,gmock_a1_01,0x53,0);
    gmock_a1_02.size_ = 5;
    gmock_a1_02.data_ = "npool";
    MockProblemBuilder::AddIntSuffix(&this->builder_->super_MockProblemBuilder,gmock_a1_02,0x52,0);
    this_00 = &this->builder_->super_MockProblemBuilder;
    local_110 = (this->options_).data_;
    local_118 = (this->options_).size_;
LAB_001c3e87:
    RVar6 = MockProblemBuilder::num_vars(this_00);
    local_e8.values_.size_ = (size_t)RVar6;
  }
  if (dual_values == (double *)0x0) {
    local_e8.dual_values_.size_ = 0;
  }
  else {
    RVar6 = MockProblemBuilder::num_algebraic_cons(&this->builder_->super_MockProblemBuilder);
    local_e8.dual_values_.size_ = (size_t)RVar6;
  }
  pMVar2 = this->solver_;
  if (((pMVar2->super_SolverImpl<MultiObjMockProblemBuilder>).super_Solver.super_BasicSolver.
       opts_read_ != true) ||
     (local_e8.objno_ = 0,
     (pMVar2->super_SolverImpl<MultiObjMockProblemBuilder>).super_Solver.super_BasicSolver.
     obj_added_ == true)) {
    iVar1 = (pMVar2->super_SolverImpl<MultiObjMockProblemBuilder>).super_Solver.super_BasicSolver.
            objno_;
    local_e8.objno_ = -iVar1;
    if (0 < iVar1) {
      local_e8.objno_ = iVar1;
    }
  }
  local_e8.options_.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.options_.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.options_.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.options_.data_ = local_110;
  local_e8.options_.size_ = local_118;
  local_e8.values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.dual_values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.dual_values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.dual_values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100 = 0;
  local_f8 = '\0';
  sVar3 = (this->overrideStub_)._M_string_length;
  local_108.data_ = &local_f8;
  local_e8.status_ = status;
  local_e8.builder_ = (MultiObjMockProblemBuilder *)this_00;
  local_e8.message_ = message.data_;
  local_e8.values_.data_ = values;
  local_e8.dual_values_.data_ = dual_values;
  if (sVar3 == 0) {
    pcVar4 = (this->stub_)._M_dataplus._M_p;
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,pcVar4,pcVar4 + (this->stub_)._M_string_length);
    std::__cxx11::string::append((char *)&local_138);
    std::__cxx11::string::operator=((string *)&local_108,(string *)&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p == &local_138.field_2) goto LAB_001c40e3;
  }
  else {
    if ((sVar3 != 1) &&
       ((pcVar5 = (this->overrideStub_)._M_dataplus._M_p, *pcVar5 == '/' || (pcVar5[1] == ':')))) {
      std::__cxx11::string::_M_assign((string *)&local_108);
      goto LAB_001c40e3;
    }
    lVar7 = std::__cxx11::string::find_last_of((char *)&this->stub_,0x21a482,0xffffffffffffffff);
    if (lVar7 == -1) {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"");
    }
    else {
      std::__cxx11::string::substr((ulong)&local_138,(ulong)&this->stub_);
    }
    std::operator+(&local_50,&local_138,&this->overrideStub_);
    std::__cxx11::string::operator=((string *)&local_108,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p == &local_138.field_2) goto LAB_001c40e3;
  }
  operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
LAB_001c40e3:
  WriteSolFile<mp::SolutionAdapter<MultiObjMockProblemBuilder>>(local_108,&local_e8);
  if (local_108.data_ != &local_f8) {
    operator_delete(local_108.data_,CONCAT71(uStack_f7,local_f8) + 1);
  }
  if (local_e8.dual_values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.dual_values_.save_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.dual_values_.save_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.dual_values_.save_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e8.values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.values_.save_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.values_.save_.super__Vector_base<double,_std::allocator<double>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.values_.save_.super__Vector_base<double,_std::allocator<double>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.options_.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.options_.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.options_.save_.super__Vector_base<long,_std::allocator<long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.options_.save_.super__Vector_base<long,_std::allocator<long>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SolutionWriterImpl<Solver, PB, Writer>::HandleSolution(
    int status, fmt::CStringRef message, const double *values,
    const double *dual_values, double) {
	if (solver_.need_multiple_solutions()
			&& values) {             // not when reporting an error
    auto kindP = mp::suf::Kind( suf::PROBLEM | suf::OUTPUT | suf::OUTONLY );
    auto kindO = mp::suf::Kind( suf::OBJ | suf::OUTPUT | suf::OUTONLY );
    builder_.AddIntSuffix("nsol", kindP, 0).
        SetValue(0, num_solutions_);
    builder_.AddIntSuffix("nsol", kindO, 0).
        SetValue(0, num_solutions_);
    builder_.AddIntSuffix("npool", kindP, 0).
        SetValue(0, num_solutions_);
    builder_.AddIntSuffix("npool", kindO, 0).
        SetValue(0, num_solutions_);
  }
  SolutionAdapter<PB> sol(
        status, &builder_, message.c_str(), options_,
        MakeArrayRef(values, values ? builder_.num_vars() : 0),
        MakeArrayRef(dual_values,
                     dual_values ? builder_.num_algebraic_cons() : 0),
        solver_.objno_used());

  std::string solFilePath;
  if (!overrideStub_.empty()) { 
    // Check if its absolute or relative
    if ((overrideStub_.length() >= 2) &&// cannot be absolute otherwise 
       ((overrideStub_[0] == '/') || // linux abs (/ ...)
        (overrideStub_[1] == ':') ))  {// windows abs (x: ///)
        solFilePath = overrideStub_; // if absolute
    }
    else { // if relative
      size_t pos = stub_.find_last_of("\\/"); //.find parent dir
      auto dir = (std::string::npos == pos) ? "" : stub_.substr(0, pos+1);
      solFilePath = dir + overrideStub_;
    }
  }
  else { solFilePath = stub_ + ".sol"; }
  
  this->Write(solFilePath, sol);
}